

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleTypeHandler<2UL>::CanStorePropertyValueDirectly
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,
          bool allowLetConst)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,allowLetConst) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x4b8,"(!allowLetConst)","!allowLetConst");
    if (!bVar3) goto LAB_00e52d00;
    *puVar5 = 0;
  }
  iVar1 = this->propertyCount;
  bVar3 = 0 < iVar1;
  if ((0 < iVar1) && (bVar3 = true, (this->descriptors[0].Id.ptr)->pid != propertyId)) {
    uVar7 = 1;
    do {
      uVar6 = uVar7 & 0xffff;
      bVar3 = (int)uVar6 < iVar1;
      if (iVar1 <= (int)uVar6) break;
      uVar7 = uVar6 + 1;
    } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar6 << 4)) + 8) !=
             propertyId);
  }
  if (bVar3 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x4c0,"(false)",
                                "Asking about a property this type handler doesn\'t know about?");
    if (!bVar4) {
LAB_00e52d00:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return bVar3;
}

Assistant:

bool SimpleTypeHandler<size>::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        Assert(!allowLetConst);
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            return true;
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }